

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

CBBox * __thiscall CDesign::GetStartBox(CBBox *__return_storage_ptr__,CDesign *this,int *pNumEdge)

{
  pointer *this_00;
  int iVar1;
  CLayer *this_01;
  iterator iVar2;
  iterator iVar3;
  size_type sVar4;
  uint *puVar5;
  int local_148;
  int local_140;
  int local_13c;
  int local_134;
  uint local_12c;
  uint local_124;
  undefined1 local_e0 [8];
  CPoint PointE;
  CPoint PointS;
  int iStartY;
  int iStartX;
  int local_54;
  undefined1 local_50 [4];
  int i;
  vector<int,_std::allocator<int>_> Y;
  vector<int,_std::allocator<int>_> X;
  int *pNumEdge_local;
  CDesign *this_local;
  CBBox *BBox;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  for (local_54 = 1; iVar1 = CBBox::T(&this->super_CBBox), local_54 <= iVar1;
      local_54 = local_54 + 1) {
    this_01 = GetLayer(this,local_54);
    CLayer::GetStartBox(this_01,(vector<int,_std::allocator<int>_> *)
                                &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                        (vector<int,_std::allocator<int>_> *)local_50);
  }
  this_00 = &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)this_00);
  iVar3 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this_00);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_50);
  iVar3 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_50)
  ;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current);
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar4 == 0) {
    iVar1 = CBBox::W(&this->super_CBBox);
    local_124 = iVar1 / 2;
  }
  else {
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,sVar4 >> 1);
    local_124 = *puVar5;
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_50);
  if (sVar4 == 0) {
    iVar1 = CBBox::H(&this->super_CBBox);
    local_12c = iVar1 / 2;
  }
  else {
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_50);
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_50,sVar4 >> 1);
    local_12c = *puVar5;
  }
  CObject::Display(0,"(%d,%d) predicted as the most congestion region\n",(ulong)local_124,
                   (ulong)local_12c);
  CPoint::CPoint((CPoint *)&PointE.m_iY);
  CPoint::CPoint((CPoint *)local_e0);
  if ((int)(local_124 - 1) < 0) {
    local_134 = 0;
  }
  else {
    local_134 = local_124 - 1;
  }
  if ((int)(local_12c - 1) < 0) {
    local_13c = 0;
  }
  else {
    local_13c = local_12c - 1;
  }
  CPoint::SetXYZ((CPoint *)&PointE.m_iY,local_134,local_13c,0);
  if (this->m_iSizeX + -1 < (int)(local_124 + 1)) {
    local_140 = this->m_iSizeX + -1;
  }
  else {
    local_140 = local_124 + 1;
  }
  if (this->m_iSizeY + -1 < (int)(local_12c + 1)) {
    local_148 = this->m_iSizeY + -1;
  }
  else {
    local_148 = local_12c + 1;
  }
  iVar1 = CBBox::T(&this->super_CBBox);
  CPoint::SetXYZ((CPoint *)local_e0,local_140,local_148,iVar1);
  CBBox::CBBox(__return_storage_ptr__);
  CBBox::Initialize(__return_storage_ptr__,(CPoint *)&PointE.m_iY,(CPoint *)local_e0);
  if (pNumEdge != (int *)0x0) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pNumEdge = (int)sVar4;
  }
  CPoint::~CPoint((CPoint *)local_e0);
  CPoint::~CPoint((CPoint *)&PointE.m_iY);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &Y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

CBBox CDesign::GetStartBox(int* pNumEdge)
{
	//!compute the starting point of box expansion, based on the # of pins.
	//!it also can be done any congestion analysis.

	vector<int>	X;
	vector<int>	Y;

	for(int i=LAYER_METAL1;i<=T();++i)	GetLayer(i)->GetStartBox(&X,&Y);


	sort(X.begin(),X.end());
	sort(Y.begin(),Y.end());

	int	iStartX		=	X.size()? X[X.size()/2]:W()/2;
	int	iStartY		=	Y.size()? Y[Y.size()/2]:H()/2;

	Display(DISPLAY_MODE_INFO,"(%d,%d) predicted as the most congestion region\n",iStartX,iStartY);

	CPoint	PointS;
	CPoint	PointE;

	PointS.SetXYZ(MAX(0,iStartX-1),MAX(0,iStartY-1),0);
	PointE.SetXYZ(MIN(m_iSizeX-1,iStartX+1),MIN(m_iSizeY-1,iStartY+1),T());

	CBBox	BBox;

	BBox.Initialize(&PointS,&PointE);

	if(pNumEdge)	*pNumEdge = X.size();
	return	BBox;
}